

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

Prog * __thiscall re2::Prog::Dump_abi_cxx11_(Prog *this)

{
  Prog *in_RSI;
  undefined1 local_30 [8];
  Workq q;
  Prog *this_local;
  
  if ((in_RSI->did_flatten_ & 1U) == 0) {
    SparseSet::SparseSet((SparseSet *)local_30,in_RSI->size_);
    AddToQueue((SparseSet *)local_30,in_RSI->start_);
    ProgToString_abi_cxx11_((re2 *)this,in_RSI,(Workq *)local_30);
    SparseSet::~SparseSet((SparseSet *)local_30);
  }
  else {
    FlattenedProgToString_abi_cxx11_((re2 *)this,in_RSI,in_RSI->start_);
  }
  return this;
}

Assistant:

string Prog::Dump() {
  if (did_flatten_)
    return FlattenedProgToString(this, start_);

  Workq q(size_);
  AddToQueue(&q, start_);
  return ProgToString(this, &q);
}